

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvhsah.hpp
# Opt level: O0

HitInfo * __thiscall BVH::treehit(BVH *this,Ray *ray,treenode *node)

{
  long lVar1;
  bool bVar2;
  Ray *in_RCX;
  BVH *in_RDX;
  HitInfo *in_RDI;
  float fVar3;
  float fVar4;
  vec3f vVar5;
  HitInfo *hit;
  HitInfo resr;
  HitInfo resl;
  Hit h;
  HitInfo *in_stack_fffffffffffffe20;
  treenode *object;
  vec3f *in_stack_fffffffffffffe28;
  Hit *pHVar6;
  HitInfo *in_stack_fffffffffffffe30;
  vec3f local_1a8;
  vec3f local_194;
  undefined8 local_188;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  treenode *in_stack_fffffffffffffe88;
  Ray in_stack_fffffffffffffea0;
  Hit local_118;
  undefined1 local_c8 [80];
  _func_int **local_78;
  treenode *local_70;
  Hit *local_68;
  treenode *in_stack_ffffffffffffffe0;
  
  if (in_RCX == (Ray *)0x0) {
    HitInfo::HitInfo(in_stack_fffffffffffffe20);
    return in_RDI;
  }
  bVar2 = AABox::intersect((AABox *)&in_RCX[1].origin.z,(Ray *)in_RDX);
  if (!bVar2) {
    HitInfo::HitInfo(in_stack_fffffffffffffe20);
    return in_RDI;
  }
  lVar1._0_4_ = (in_RCX->dir).y;
  lVar1._4_4_ = (in_RCX->dir).z;
  if (lVar1 != 0) {
    HitInfo::HitInfo(in_stack_fffffffffffffe20);
    Primitive::Hit::Hit(&in_stack_fffffffffffffe20->super_Hit);
    local_78 = (in_RDX->super_Accelarator)._vptr_Accelarator;
    object = in_RDX->root;
    pHVar6 = (Hit *)(in_RDX->list).
                    super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    local_70 = object;
    local_68 = pHVar6;
    bVar2 = opaqueHit(in_stack_fffffffffffffe88,in_stack_fffffffffffffea0,
                      (Hit *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    if (!bVar2) {
      return in_RDI;
    }
    HitInfo::HitInfo(in_stack_fffffffffffffe30,pHVar6,(Object *)object);
    memcpy(in_RDI,local_c8,0x50);
    return in_RDI;
  }
  treehit(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
  bVar2 = Primitive::Hit::operator_cast_to_bool(&local_118);
  if (!bVar2) {
    treehit(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    return in_RDI;
  }
  treehit(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
  bVar2 = Primitive::Hit::operator_cast_to_bool((Hit *)&stack0xfffffffffffffe98);
  if (bVar2) {
    vVar5 = ::operator-((vec3f *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_188 = vVar5._0_8_;
    fVar3 = sqrlen((vec3f *)&stack0xfffffffffffffe88);
    vVar5 = ::operator-((vec3f *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_1a8._0_8_ = vVar5._0_8_;
    local_194.x = local_1a8.x;
    local_194.y = local_1a8.y;
    local_1a8.z = vVar5.z;
    local_194.z = local_1a8.z;
    fVar4 = sqrlen(&local_194);
    if (fVar4 <= fVar3) {
      pHVar6 = (Hit *)&stack0xfffffffffffffe98;
      goto LAB_0011a34d;
    }
  }
  pHVar6 = &local_118;
LAB_0011a34d:
  memcpy(in_RDI,pHVar6,0x50);
  return in_RDI;
}

Assistant:

HitInfo treehit(const Ray& ray, treenode* node) {
		if (node == NULL) return HitInfo();
		if (!node->bound.intersect(ray)) return HitInfo();
		if (node->shape != NULL) {
			HitInfo hit;
			Primitive::Hit h;
			if (opaqueHit(node, ray, &h)) {
				hit = HitInfo(h, node->object);
			}
			return hit;
		}
		HitInfo resl = treehit(ray, node->lc);
		if (!resl) return treehit(ray, node->rc);
		HitInfo resr = treehit(ray, node->rc);
		return (!resr || sqrlen(resl.p - ray.origin) < sqrlen(resr.p - ray.origin))? resl: resr;
	}